

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

void __thiscall FOOLElimination::apply(FOOLElimination *this,UnitList **units)

{
  bool bVar1;
  uint uVar2;
  Clause *this_00;
  UserErrorException *this_01;
  Clause *pCVar3;
  List<Kernel::Unit_*> *pLVar4;
  List<Kernel::Unit_*> **in_RSI;
  long in_RDI;
  Unit *processedUnit;
  FormulaUnit *in_stack_00000040;
  FOOLElimination *in_stack_00000048;
  uint i;
  Clause *clause;
  Unit *unit;
  DelIterator us;
  Unit *in_stack_ffffffffffffff48;
  DelIterator *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint local_3c;
  DelIterator local_28;
  List<Kernel::Unit_*> **local_10;
  
  local_10 = in_RSI;
  Lib::List<Kernel::Unit_*>::DelIterator::DelIterator(&local_28,in_RSI);
  do {
    while( true ) {
      bVar1 = Lib::List<Kernel::Unit_*>::DelIterator::hasNext
                        ((DelIterator *)in_stack_ffffffffffffff48);
      if (!bVar1) {
        pLVar4 = Lib::List<Kernel::Unit_*>::concat
                           ((List<Kernel::Unit_*> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (List<Kernel::Unit_*> *)in_stack_ffffffffffffff50);
        *local_10 = pLVar4;
        *(undefined8 *)(in_RDI + 8) = 0;
        return;
      }
      this_00 = (Clause *)Lib::List<Kernel::Unit_*>::DelIterator::next(in_stack_ffffffffffffff50);
      bVar1 = Kernel::Unit::isClause((Unit *)this_00);
      if (bVar1) break;
      pCVar3 = (Clause *)apply(in_stack_00000048,in_stack_00000040);
      if (pCVar3 != this_00) {
        Lib::List<Kernel::Unit_*>::DelIterator::replace
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
    local_3c = 0;
    while (in_stack_ffffffffffffff5c = local_3c, uVar2 = Kernel::Clause::length(this_00),
          in_stack_ffffffffffffff5c < uVar2) {
      Kernel::Clause::operator[](this_00,local_3c);
      bVar1 = Kernel::Term::shared((Term *)0xb92a4e);
      if (!bVar1) {
        this_01 = (UserErrorException *)__cxa_allocate_exception(0x50);
        Kernel::Clause::literalsOnlyToString_abi_cxx11_(this_00);
        std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01)
        ;
        Lib::UserErrorException::Exception(this_01,(string *)in_stack_ffffffffffffff48);
        __cxa_throw(this_01,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      local_3c = local_3c + 1;
    }
  } while( true );
}

Assistant:

void FOOLElimination::apply(UnitList*& units) {
  UnitList::DelIterator us(units);
  while(us.hasNext()) {
    Unit* unit = us.next();
    if(unit->isClause()) {
      Clause* clause = static_cast<Clause*>(unit);
      for (unsigned i = 0; i < clause->length(); i++) {
        // we do not allow special terms in clauses so we check that all clause literals
        // are shared (special terms can not be shared)
        if(!(*clause)[i]->shared()){
          USER_ERROR("Input clauses (cnf) cannot use $ite, $let or $o terms. Error in "+clause->literalsOnlyToString());
        }
      }
      continue;
    }
    Unit* processedUnit = apply(static_cast<FormulaUnit*>(unit));
    if (processedUnit != unit) {
      us.replace(processedUnit);
    }
  }

  // Note that the "$true != $false" axiom is treated as a theory axiom and
  // added in TheoryAxiom.cpp

  units = UnitList::concat(_defs, units);
  _defs = 0;
}